

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_tri_edge(REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_cell;
  REF_INT node3;
  REF_INT node2;
  REF_INT nodes [27];
  REF_INT local_34;
  REF_INT local_30;
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_CELL ref_cell;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  unique0x00012000 = ref_grid->cell[3];
  ref_grid_local._4_4_ = ref_swap_node23(ref_grid,node0,node1,&new_cell,&ref_private_macro_code_rss)
  ;
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_cell_list_with2(stack0xffffffffffffffd8,node0,node1,2,cell_to_swap,&local_34);
    if (ref_grid_local._4_4_ == 0) {
      if ((long)cell_to_swap[0] == 2) {
        ref_grid_local._4_4_ = ref_cell_nodes(stack0xffffffffffffffd8,local_34,&node3);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_cell_remove(stack0xffffffffffffffd8,local_34);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_cell_remove(stack0xffffffffffffffd8,local_30);
            if (ref_grid_local._4_4_ == 0) {
              node2 = ref_private_macro_code_rss;
              nodes[0] = new_cell;
              node3 = node0;
              ref_grid_local._4_4_ =
                   ref_cell_add(stack0xffffffffffffffd8,&node3,&ref_private_macro_code_rss_1);
              if (ref_grid_local._4_4_ == 0) {
                node2 = new_cell;
                nodes[0] = ref_private_macro_code_rss;
                node3 = node1;
                ref_grid_local._4_4_ =
                     ref_cell_add(stack0xffffffffffffffd8,&node3,&ref_private_macro_code_rss_1);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x2c0,"ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"add node0 version")
                  ;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,700,"ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"add node0 version");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x2b7,"ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"remove");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x2b6,"ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"remove");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x2b5,"ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"nodes tri0");
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x2b4,"ref_swap_tri_edge","there should be two triangles for manifold",2,
               (long)cell_to_swap[0]);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b3,
             "ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"more then two");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x2b0,
           "ref_swap_tri_edge",(ulong)ref_grid_local._4_4_,"other nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_swap_tri_edge(REF_GRID ref_grid, REF_INT node0,
                                            REF_INT node1) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_INT new_cell;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_cell_remove(ref_cell, cell_to_swap[0]), "remove");
  RSS(ref_cell_remove(ref_cell, cell_to_swap[1]), "remove");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");

  return REF_SUCCESS;
}